

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BOV.c
# Opt level: O3

bov_order_t * bov_order_update(bov_order_t *order,GLuint *elements,GLsizei n)

{
  GLsizei GVar1;
  
  GVar1 = 0;
  if (elements != (GLuint *)0x0) {
    GVar1 = n;
  }
  order->eboLen = GVar1;
  (*glad_glBindBuffer)(0x8893,order->ebo);
  if (order->eboCapacity < order->eboLen) {
    (*glad_glBufferData)(0x8893,(long)n << 2,elements,0x88e8);
    order->eboCapacity = order->eboLen;
  }
  else if (elements != (GLuint *)0x0) {
    (*glad_glBufferSubData)(0x8893,0,(long)n << 2,elements);
  }
  return order;
}

Assistant:

bov_order_t* bov_order_update(bov_order_t* order, const GLuint* elements, GLsizei n)
{
	order->eboLen = elements==NULL ? 0 : n;

	glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, order->ebo);
	if(order->eboLen > order->eboCapacity) {
		glBufferData(GL_ELEMENT_ARRAY_BUFFER, n * sizeof(GLuint), elements,
		             GL_DYNAMIC_DRAW);
		order->eboCapacity = order->eboLen;
	}
	else if(elements!=NULL){
		glBufferSubData(GL_ELEMENT_ARRAY_BUFFER, 0, n * sizeof(GLuint), elements);
	}

	return order;
}